

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O0

QOperation
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::getOperation
          (char *content,SizeT *offset,SizeT end_offset)

{
  bool bVar1;
  int local_28;
  SizeT32 skip;
  SizeT end_offset_local;
  SizeT *offset_local;
  char *content_local;
  
LAB_0011c583:
  if (end_offset <= *offset) {
    return NoOp;
  }
  switch(content[*offset]) {
  case '!':
    if (content[*offset + 1] == '=') {
      return NotEqual;
    }
    return Error;
  default:
    break;
  case '%':
    return Remainder;
  case '&':
    if (content[*offset + 1] == '&') {
      return And;
    }
    return BitwiseAnd;
  case '(':
    *offset = *offset + 1;
    local_28 = 0;
    while (*offset < end_offset) {
      if (content[*offset] == ')') {
        if (local_28 == 0) break;
        local_28 = local_28 + -1;
      }
      else if (content[*offset] == '(') {
        local_28 = local_28 + 1;
      }
      *offset = *offset + 1;
    }
    if (end_offset <= *offset) {
      return Error;
    }
    goto LAB_0011c583;
  case '*':
    return Multiplication;
  case '+':
    bVar1 = isExpression(content,*offset);
    if (bVar1) {
      return Addition;
    }
    break;
  case '-':
    bVar1 = isExpression(content,*offset);
    if (bVar1) {
      return Subtraction;
    }
    break;
  case '/':
    return Division;
  case '<':
    if (content[*offset + 1] == '=') {
      return LessOrEqual;
    }
    return Less;
  case '=':
    if (content[*offset + 1] == '=') {
      return Equal;
    }
    return Error;
  case '>':
    if (content[*offset + 1] == '=') {
      return GreaterOrEqual;
    }
    return Greater;
  case '^':
    return Exponent;
  case '{':
    goto switchD_0011c5c4_caseD_7b;
  case '|':
    if (content[*offset + 1] == '|') {
      return Or;
    }
    return BitwiseOr;
  }
  *offset = *offset + 1;
  goto LAB_0011c583;
switchD_0011c5c4_caseD_7b:
  do {
    *offset = *offset + 1;
    bVar1 = false;
    if (*offset < end_offset) {
      bVar1 = content[*offset] != '}';
    }
  } while (bVar1);
  if (end_offset <= *offset) {
    *offset = end_offset;
    return Error;
  }
  goto LAB_0011c583;
}

Assistant:

static QOperation getOperation(const Char_T *content, SizeT &offset, const SizeT end_offset) noexcept {
        using QOperationSymbol = QOperationSymbol_T<Char_T>;

        while (offset < end_offset) {
            switch (content[offset]) {
                case QOperationSymbol::OrExp: { // ||
                    if (content[(offset + 1)] == QOperationSymbol::OrExp) {
                        return QOperation::Or;
                    }

                    return QOperation::BitwiseOr;
                }

                case QOperationSymbol::AndExp: { // &&
                    if (content[(offset + 1)] == QOperationSymbol::AndExp) {
                        return QOperation::And;
                    }

                    return QOperation::BitwiseAnd;
                }

                case QOperationSymbol::GreaterExp: { // > or >=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::GreaterOrEqual;
                    }

                    return QOperation::Greater;
                }

                case QOperationSymbol::LessExp: { // < or <=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::LessOrEqual;
                    }

                    return QOperation::Less;
                }

                case QOperationSymbol::NotExp: { // !=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::NotEqual;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::EqualExp: { // ==
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::Equal;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::SubtractExp: {
                    if (isExpression(content, offset)) {
                        return QOperation::Subtraction;
                    }

                    break;
                }

                case QOperationSymbol::AddExp: {
                    if (isExpression(content, offset)) {
                        return QOperation::Addition;
                    }

                    break;
                }

                case QOperationSymbol::DivideExp: {
                    return QOperation::Division;
                }

                case QOperationSymbol::MultipleExp: {
                    return QOperation::Multiplication;
                }

                case QOperationSymbol::RemainderExp: {
                    return QOperation::Remainder;
                }

                case QOperationSymbol::ExponentExp: {
                    return QOperation::Exponent;
                }

                case QOperationSymbol::ParenthesesStart: {
                    ++offset;
                    SizeT32 skip{0U};

                    while (offset < end_offset) {
                        if (content[offset] == QOperationSymbol::ParenthesesEnd) {
                            if (skip == 0U) {
                                break;
                            }

                            --skip;
                        } else if (content[offset] == QOperationSymbol::ParenthesesStart) {
                            ++skip;
                        }

                        ++offset;
                    }

                    if (offset < end_offset) {
                        continue;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::BracketStart: {
                    do {
                        ++offset;
                    } while ((offset < end_offset) && (content[offset] != QOperationSymbol::BracketEnd));

                    if (offset < end_offset) {
                        continue;
                    }

                    offset = end_offset;
                    return QOperation::Error;
                }

                default: {
                }
            }

            ++offset;
        }

        return QOperation::NoOp;
    }